

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsocket.c
# Opt level: O0

int mg_socket_connect(int sock,sockaddr *addr,socklen_t addrlen)

{
  int iVar1;
  int *piVar2;
  socklen_t in_EDX;
  sockaddr *in_RSI;
  int in_EDI;
  bool bVar3;
  long result;
  long status;
  undefined4 local_4;
  
  do {
    iVar1 = connect(in_EDI,in_RSI,in_EDX);
    bVar3 = false;
    if ((long)iVar1 == -1) {
      piVar2 = __errno_location();
      bVar3 = *piVar2 == 4;
    }
  } while (bVar3);
  iVar1 = mg_socket_test_status_is_error((long)iVar1);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    local_4 = -100;
  }
  return local_4;
}

Assistant:

int mg_socket_connect(int sock, const struct sockaddr *addr,
                      socklen_t addrlen) {
  long status = MG_RETRY_ON_EINTR(connect(sock, addr, addrlen));
  if (mg_socket_test_status_is_error(status)) {
    return MG_ERROR_SOCKET;
  }
#ifdef __EMSCRIPTEN__
  if (mg_wasm_suspend_until_ready_to_write(sock) == -1) {
    return MG_ERROR_SOCKET;
  }
#endif

  return MG_SUCCESS;
}